

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O1

int resist(monst *mtmp,char oclass,int damage,int domsg)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  byte bVar6;
  long lVar7;
  int iVar8;
  
  bVar6 = oclass - 2;
  if ((bVar6 < 10) && ((0x2d5U >> (bVar6 & 0x1f) & 1) != 0)) {
    iVar8 = *(int *)(&DAT_002da8ec + (ulong)bVar6 * 4);
  }
  else {
    iVar8 = u.ulevel + 100;
  }
  bVar6 = mtmp->m_lev;
  uVar2 = 0x32;
  if ((bVar6 < 0x33) && (uVar2 = (uint)bVar6, bVar6 == 0)) {
    uVar2 = 1;
    if (mtmp->data < (permonst *)((long)&mons[0x168].mname + 1)) {
      uVar2 = u.ulevel;
    }
    if (mtmp->data < mons + 0x159) {
      uVar2 = 1;
    }
  }
  uVar3 = mt_random();
  lVar5 = SUB168(ZEXT416(uVar3) % SEXT816((long)(int)(iVar8 - uVar2)),0);
  lVar7 = (long)mtmp->data->mr;
  if (lVar5 < lVar7) {
    if (domsg != 0) {
      shieldeff(mtmp->mx,mtmp->my);
      pcVar4 = Monnam(mtmp);
      pline("%s resists!",pcVar4);
    }
    damage = (damage - (damage + 1 >> 0x1f)) + 1 >> 1;
  }
  if (damage != 0) {
    piVar1 = &mtmp->mhp;
    iVar8 = *piVar1;
    *piVar1 = *piVar1 - damage;
    if (*piVar1 == 0 || SBORROW4(iVar8,damage) != *piVar1 < 0) {
      if (m_using == '\0') {
        killed(mtmp);
      }
      else {
        monkilled(mtmp,"",0xf2);
      }
    }
  }
  return (int)(lVar5 < lVar7);
}

Assistant:

int resist(struct monst *mtmp, char oclass, int damage, int domsg)
{
	int resisted;
	int alev, dlev;

	/* attack level */
	switch (oclass) {
	    case WAND_CLASS:	alev = 12;	 break;
	    case TOOL_CLASS:	alev = 10;	 break;	/* instrument */
	    case WEAPON_CLASS:	alev = 10;	 break;	/* artifact */
	    case SCROLL_CLASS:	alev =  9;	 break;
	    case POTION_CLASS:	alev =  6;	 break;
	    case RING_CLASS:	alev =  5;	 break;
	    default:		alev = u.ulevel; break;	/* spell */
	}
	/* defense level */
	dlev = (int)mtmp->m_lev;
	if (dlev > 50) dlev = 50;
	else if (dlev < 1) dlev = is_mplayer(mtmp->data) ? u.ulevel : 1;

	resisted = rn2(100 + alev - dlev) < mtmp->data->mr;
	if (resisted) {
	    if (domsg) {
		shieldeff(mtmp->mx, mtmp->my);
		pline("%s resists!", Monnam(mtmp));
	    }
	    damage = (damage + 1) / 2;
	}

	if (damage) {
	    mtmp->mhp -= damage;
	    if (mtmp->mhp < 1) {
		if (m_using) monkilled(mtmp, "", AD_RBRE);
		else killed(mtmp);
	    }
	}
	return resisted;
}